

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  ImVec2 IVar2;
  ImVec2 *in_stack_ffffffffffffff48;
  undefined4 local_ac;
  
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 8) = IVar2;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x10) * in_XMM0_Da);
  *(float *)(in_RDI + 0x10) = fVar1;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0x18) = IVar2;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x2c) * in_XMM0_Da);
  *(float *)(in_RDI + 0x2c) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x34) * in_XMM0_Da);
  *(float *)(in_RDI + 0x34) = fVar1;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0x3c) = IVar2;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x44) * in_XMM0_Da);
  *(float *)(in_RDI + 0x44) = fVar1;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0x4c) = IVar2;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0x54) = IVar2;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0x5c) = IVar2;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 100) = IVar2;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x6c) * in_XMM0_Da);
  *(float *)(in_RDI + 0x6c) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x70) * in_XMM0_Da);
  *(float *)(in_RDI + 0x70) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x74) * in_XMM0_Da);
  *(float *)(in_RDI + 0x74) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x78) * in_XMM0_Da);
  *(float *)(in_RDI + 0x78) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x7c) * in_XMM0_Da);
  *(float *)(in_RDI + 0x7c) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x80) * in_XMM0_Da);
  *(float *)(in_RDI + 0x80) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x84) * in_XMM0_Da);
  *(float *)(in_RDI + 0x84) = fVar1;
  fVar1 = ImFloor(*(float *)(in_RDI + 0x88) * in_XMM0_Da);
  *(float *)(in_RDI + 0x88) = fVar1;
  if ((*(float *)(in_RDI + 0x90) != 3.4028235e+38) || (NAN(*(float *)(in_RDI + 0x90)))) {
    local_ac = ImFloor(*(float *)(in_RDI + 0x90) * in_XMM0_Da);
  }
  else {
    local_ac = 3.4028235e+38;
  }
  *(float *)(in_RDI + 0x90) = local_ac;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0xa8) = IVar2;
  ::operator*(in_stack_ffffffffffffff48,0.0);
  IVar2 = ImFloor(in_stack_ffffffffffffff48);
  *(ImVec2 *)(in_RDI + 0xb0) = IVar2;
  fVar1 = ImFloor(*(float *)(in_RDI + 0xb8) * in_XMM0_Da);
  *(float *)(in_RDI + 0xb8) = fVar1;
  return;
}

Assistant:

void ImGuiStyle::ScaleAllSizes(float scale_factor)
{
    WindowPadding = ImFloor(WindowPadding * scale_factor);
    WindowRounding = ImFloor(WindowRounding * scale_factor);
    WindowMinSize = ImFloor(WindowMinSize * scale_factor);
    ChildRounding = ImFloor(ChildRounding * scale_factor);
    PopupRounding = ImFloor(PopupRounding * scale_factor);
    FramePadding = ImFloor(FramePadding * scale_factor);
    FrameRounding = ImFloor(FrameRounding * scale_factor);
    ItemSpacing = ImFloor(ItemSpacing * scale_factor);
    ItemInnerSpacing = ImFloor(ItemInnerSpacing * scale_factor);
    CellPadding = ImFloor(CellPadding * scale_factor);
    TouchExtraPadding = ImFloor(TouchExtraPadding * scale_factor);
    IndentSpacing = ImFloor(IndentSpacing * scale_factor);
    ColumnsMinSpacing = ImFloor(ColumnsMinSpacing * scale_factor);
    ScrollbarSize = ImFloor(ScrollbarSize * scale_factor);
    ScrollbarRounding = ImFloor(ScrollbarRounding * scale_factor);
    GrabMinSize = ImFloor(GrabMinSize * scale_factor);
    GrabRounding = ImFloor(GrabRounding * scale_factor);
    LogSliderDeadzone = ImFloor(LogSliderDeadzone * scale_factor);
    TabRounding = ImFloor(TabRounding * scale_factor);
    TabMinWidthForCloseButton = (TabMinWidthForCloseButton != FLT_MAX) ? ImFloor(TabMinWidthForCloseButton * scale_factor) : FLT_MAX;
    DisplayWindowPadding = ImFloor(DisplayWindowPadding * scale_factor);
    DisplaySafeAreaPadding = ImFloor(DisplaySafeAreaPadding * scale_factor);
    MouseCursorScale = ImFloor(MouseCursorScale * scale_factor);
}